

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O3

v4sf * rfftb1_ps(int n,v4sf *input_readonly,v4sf *work1,v4sf *work2,float *wa,int *ifac)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  uint uVar4;
  int iVar5;
  uint l1;
  v4sf *pafVar6;
  v4sf *pafVar7;
  v4sf *pafVar8;
  int iVar9;
  long lVar10;
  v4sf *pafVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  v4sf *pafVar17;
  v4sf *pafVar18;
  long lVar19;
  long lVar20;
  v4sf *pafVar21;
  long lVar22;
  v4sf *pafVar23;
  long lVar24;
  long lVar25;
  v4sf *pafVar26;
  long lVar27;
  v4sf *pafVar28;
  ulong uVar29;
  bool bVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  int local_100;
  v4sf *local_f8;
  ulong local_f0;
  v4sf *local_e0;
  v4sf *local_c8;
  
  local_f8 = work2;
  if (input_readonly == work2) {
    local_f8 = work1;
  }
  if (local_f8 != input_readonly) {
    uVar4 = ifac[1];
    if (0 < (int)uVar4) {
      iVar12 = 0;
      lVar15 = 1;
      l1 = 1;
      do {
        iVar5 = ifac[lVar15 + 1];
        local_100 = n / (int)(iVar5 * l1);
        switch(iVar5) {
        case 2:
          radb2_ps(local_100,l1,input_readonly,local_f8,wa + iVar12);
          break;
        case 3:
          if (0 < (int)l1) {
            lVar19 = (long)local_100;
            uVar29 = (ulong)l1;
            pafVar11 = input_readonly;
            pafVar26 = local_f8;
            uVar13 = uVar29;
            do {
              pafVar6 = pafVar11 + lVar19 * 2 + -1;
              fVar42 = (*pafVar6)[0] + (*pafVar6)[0];
              fVar31 = (*pafVar6)[1] + (*pafVar6)[1];
              fVar32 = (*pafVar6)[2] + (*pafVar6)[2];
              fVar33 = (*pafVar6)[3] + (*pafVar6)[3];
              fVar36 = (*pafVar11)[1];
              fVar38 = (*pafVar11)[2];
              fVar40 = (*pafVar11)[3];
              fVar34 = fVar42 * -0.5 + (*pafVar11)[0];
              fVar35 = fVar31 * -0.5 + fVar36;
              fVar37 = fVar32 * -0.5 + fVar38;
              fVar39 = fVar33 * -0.5 + fVar40;
              (*pafVar26)[0] = fVar42 + (*pafVar11)[0];
              (*pafVar26)[1] = fVar31 + fVar36;
              (*pafVar26)[2] = fVar32 + fVar38;
              (*pafVar26)[3] = fVar33 + fVar40;
              pafVar6 = pafVar11 + lVar19 * 2;
              fVar36 = (*pafVar6)[0] * 1.7320508;
              fVar38 = (*pafVar6)[1] * 1.7320508;
              fVar40 = (*pafVar6)[2] * 1.7320508;
              fVar42 = (*pafVar6)[3] * 1.7320508;
              pfVar1 = (float *)((long)*pafVar26 + lVar19 * 0x10 * uVar29);
              *pfVar1 = fVar34 - fVar36;
              pfVar1[1] = fVar35 - fVar38;
              pfVar1[2] = fVar37 - fVar40;
              pfVar1[3] = fVar39 - fVar42;
              pfVar1 = (float *)((long)*pafVar26 + lVar19 * 0x10 * (ulong)(l1 * 2));
              *pfVar1 = fVar36 + fVar34;
              pfVar1[1] = fVar38 + fVar35;
              pfVar1[2] = fVar40 + fVar37;
              pfVar1[3] = fVar42 + fVar39;
              pafVar26 = pafVar26 + lVar19;
              pafVar11 = pafVar11 + lVar19 * 3;
              uVar13 = uVar13 - 1;
            } while (uVar13 != 0);
            if (local_100 != 1) {
              local_f0 = 0;
              do {
                if (2 < local_100) {
                  lVar22 = (local_f0 * 3 + 2) * lVar19;
                  lVar10 = (local_f0 * 3 + 1) * lVar19;
                  lVar20 = local_f0 * 3 * lVar19;
                  lVar25 = (local_f0 + uVar29) * lVar19;
                  lVar24 = (local_f0 + l1 * 2) * lVar19;
                  lVar16 = 2;
                  do {
                    pfVar1 = (float *)((long)*input_readonly +
                                      ((long)(((ulong)(uint)((int)lVar10 + (int)(lVar19 - lVar16))
                                              << 0x20) + -0x100000000) >> 0x1c));
                    fVar36 = *pfVar1;
                    fVar38 = pfVar1[1];
                    fVar40 = pfVar1[2];
                    fVar42 = pfVar1[3];
                    lVar27 = lVar16 + -1;
                    pafVar11 = input_readonly + lVar22 + lVar27;
                    fVar31 = (*pafVar11)[0];
                    fVar32 = (*pafVar11)[1];
                    fVar33 = (*pafVar11)[2];
                    fVar34 = (*pafVar11)[3];
                    fVar41 = fVar31 + fVar36;
                    fVar43 = fVar32 + fVar38;
                    fVar44 = fVar33 + fVar40;
                    fVar45 = fVar34 + fVar42;
                    pafVar11 = input_readonly + lVar20 + lVar27;
                    fVar35 = (*pafVar11)[1];
                    fVar37 = (*pafVar11)[2];
                    fVar39 = (*pafVar11)[3];
                    fVar57 = (*pafVar11)[0] - fVar41 * 0.5;
                    fVar52 = fVar35 - fVar43 * 0.5;
                    fVar54 = fVar37 - fVar44 * 0.5;
                    fVar56 = fVar39 - fVar45 * 0.5;
                    pafVar26 = local_f8 + local_f0 * lVar19 + lVar27;
                    (*pafVar26)[0] = fVar41 + (*pafVar11)[0];
                    (*pafVar26)[1] = fVar43 + fVar35;
                    (*pafVar26)[2] = fVar44 + fVar37;
                    (*pafVar26)[3] = fVar45 + fVar39;
                    pafVar11 = input_readonly + lVar10 + (lVar19 - lVar16);
                    fVar35 = (*pafVar11)[0];
                    fVar37 = (*pafVar11)[1];
                    fVar39 = (*pafVar11)[2];
                    fVar41 = (*pafVar11)[3];
                    pafVar11 = input_readonly + lVar22 + lVar16;
                    fVar43 = (*pafVar11)[0];
                    fVar44 = (*pafVar11)[1];
                    fVar45 = (*pafVar11)[2];
                    fVar46 = (*pafVar11)[3];
                    fVar58 = fVar43 - fVar35;
                    fVar59 = fVar44 - fVar37;
                    fVar60 = fVar45 - fVar39;
                    fVar61 = fVar46 - fVar41;
                    pafVar11 = input_readonly + lVar20 + lVar16;
                    fVar47 = (*pafVar11)[1];
                    fVar48 = (*pafVar11)[2];
                    fVar49 = (*pafVar11)[3];
                    fVar50 = (*pafVar11)[0] - fVar58 * 0.5;
                    fVar51 = fVar47 - fVar59 * 0.5;
                    fVar53 = fVar48 - fVar60 * 0.5;
                    fVar55 = fVar49 - fVar61 * 0.5;
                    pafVar26 = local_f8 + local_f0 * lVar19 + lVar16;
                    (*pafVar26)[0] = fVar58 + (*pafVar11)[0];
                    (*pafVar26)[1] = fVar59 + fVar47;
                    (*pafVar26)[2] = fVar60 + fVar48;
                    (*pafVar26)[3] = fVar61 + fVar49;
                    fVar36 = (fVar31 - fVar36) * 0.8660254;
                    fVar38 = (fVar32 - fVar38) * 0.8660254;
                    fVar33 = (fVar33 - fVar40) * 0.8660254;
                    fVar34 = (fVar34 - fVar42) * 0.8660254;
                    fVar40 = (fVar43 + fVar35) * 0.8660254;
                    fVar42 = (fVar44 + fVar37) * 0.8660254;
                    fVar31 = (fVar45 + fVar39) * 0.8660254;
                    fVar32 = (fVar46 + fVar41) * 0.8660254;
                    fVar35 = fVar57 - fVar40;
                    fVar37 = fVar52 - fVar42;
                    fVar39 = fVar54 - fVar31;
                    fVar41 = fVar56 - fVar32;
                    fVar40 = fVar40 + fVar57;
                    fVar42 = fVar42 + fVar52;
                    fVar31 = fVar31 + fVar54;
                    fVar32 = fVar32 + fVar56;
                    fVar43 = fVar36 + fVar50;
                    fVar44 = fVar38 + fVar51;
                    fVar45 = fVar33 + fVar53;
                    fVar46 = fVar34 + fVar55;
                    fVar50 = fVar50 - fVar36;
                    fVar51 = fVar51 - fVar38;
                    fVar53 = fVar53 - fVar33;
                    fVar55 = fVar55 - fVar34;
                    fVar36 = wa[(long)iVar12 + lVar16 + -2];
                    fVar38 = wa[(long)iVar12 + lVar16 + -1];
                    pafVar11 = local_f8 + lVar25 + lVar27;
                    (*pafVar11)[0] = fVar35 * fVar36 - fVar38 * fVar43;
                    (*pafVar11)[1] = fVar37 * fVar36 - fVar38 * fVar44;
                    (*pafVar11)[2] = fVar39 * fVar36 - fVar38 * fVar45;
                    (*pafVar11)[3] = fVar41 * fVar36 - fVar38 * fVar46;
                    pafVar11 = local_f8 + lVar25 + lVar16;
                    (*pafVar11)[0] = fVar36 * fVar43 + fVar35 * fVar38;
                    (*pafVar11)[1] = fVar36 * fVar44 + fVar37 * fVar38;
                    (*pafVar11)[2] = fVar36 * fVar45 + fVar39 * fVar38;
                    (*pafVar11)[3] = fVar36 * fVar46 + fVar41 * fVar38;
                    fVar36 = wa[(long)(local_100 + iVar12) + lVar16 + -2];
                    fVar38 = wa[(long)(local_100 + iVar12) + lVar16 + -1];
                    pafVar11 = local_f8 + lVar24 + lVar27;
                    (*pafVar11)[0] = fVar40 * fVar36 - fVar38 * fVar50;
                    (*pafVar11)[1] = fVar42 * fVar36 - fVar38 * fVar51;
                    (*pafVar11)[2] = fVar31 * fVar36 - fVar38 * fVar53;
                    (*pafVar11)[3] = fVar32 * fVar36 - fVar38 * fVar55;
                    pafVar11 = local_f8 + lVar24 + lVar16;
                    (*pafVar11)[0] = fVar36 * fVar50 + fVar40 * fVar38;
                    (*pafVar11)[1] = fVar36 * fVar51 + fVar42 * fVar38;
                    (*pafVar11)[2] = fVar36 * fVar53 + fVar31 * fVar38;
                    (*pafVar11)[3] = fVar36 * fVar55 + fVar32 * fVar38;
                    lVar16 = lVar16 + 2;
                  } while (lVar16 < lVar19);
                }
                local_f0 = local_f0 + 1;
              } while (local_f0 != uVar29);
            }
          }
          break;
        case 4:
          radb4_ps(local_100,l1,input_readonly,local_f8,wa + iVar12,wa + (local_100 + iVar12),
                   wa + (local_100 + iVar12 + local_100));
          break;
        case 5:
          if (0 < (int)l1) {
            iVar9 = local_100 + iVar12 + local_100;
            lVar16 = (long)(int)(~l1 * local_100 + -1);
            pafVar23 = input_readonly + (long)~(local_100 * 6) + 1;
            lVar20 = (long)local_100;
            uVar13 = (ulong)l1;
            lVar19 = uVar13 + 1;
            lVar10 = ((ulong)(l1 * 5) + 1) * lVar20;
            lVar25 = ((ulong)(l1 << 2) + 1) * lVar20;
            lVar27 = ((ulong)(l1 * 3) + 1) * lVar20;
            lVar24 = ((ulong)(l1 * 2) + 1) * lVar20;
            lVar22 = lVar19 * lVar20;
            pafVar11 = local_f8 + lVar10 + 1;
            pafVar26 = local_f8 + lVar25 + 1;
            pafVar6 = local_f8 + lVar27 + 1;
            pafVar28 = local_f8 + lVar24 + 1;
            pafVar7 = local_f8 + lVar22 + 1;
            do {
              pafVar17 = pafVar23 + lVar20 * 8 + -1;
              pafVar21 = pafVar23 + lVar20 * 8;
              fVar31 = (*pafVar21)[0] + (*pafVar21)[0];
              fVar32 = (*pafVar21)[1] + (*pafVar21)[1];
              fVar33 = (*pafVar21)[2] + (*pafVar21)[2];
              fVar34 = (*pafVar21)[3] + (*pafVar21)[3];
              pafVar8 = pafVar23 + lVar20 * 10 + -1;
              pafVar21 = pafVar23 + lVar20 * 10;
              fVar43 = (*pafVar21)[0] + (*pafVar21)[0];
              fVar44 = (*pafVar21)[1] + (*pafVar21)[1];
              fVar45 = (*pafVar21)[2] + (*pafVar21)[2];
              fVar46 = (*pafVar21)[3] + (*pafVar21)[3];
              fVar51 = (*pafVar17)[0] + (*pafVar17)[0];
              fVar53 = (*pafVar17)[1] + (*pafVar17)[1];
              fVar55 = (*pafVar17)[2] + (*pafVar17)[2];
              fVar57 = (*pafVar17)[3] + (*pafVar17)[3];
              fVar35 = (*pafVar8)[0] + (*pafVar8)[0];
              fVar37 = (*pafVar8)[1] + (*pafVar8)[1];
              fVar39 = (*pafVar8)[2] + (*pafVar8)[2];
              fVar41 = (*pafVar8)[3] + (*pafVar8)[3];
              pafVar21 = pafVar23 + lVar20 * 6;
              fVar36 = (*pafVar21)[0];
              fVar38 = (*pafVar21)[1];
              fVar40 = (*pafVar21)[2];
              fVar42 = (*pafVar21)[3];
              pafVar21 = pafVar7 + lVar16;
              (*pafVar21)[0] = fVar51 + fVar35 + fVar36;
              (*pafVar21)[1] = fVar53 + fVar37 + fVar38;
              (*pafVar21)[2] = fVar55 + fVar39 + fVar40;
              (*pafVar21)[3] = fVar57 + fVar41 + fVar42;
              fVar47 = (fVar51 * 0.309017 - fVar35 * 0.809017) + fVar36;
              fVar48 = (fVar53 * 0.309017 - fVar37 * 0.809017) + fVar38;
              fVar49 = (fVar55 * 0.309017 - fVar39 * 0.809017) + fVar40;
              fVar50 = (fVar57 * 0.309017 - fVar41 * 0.809017) + fVar42;
              fVar36 = (fVar35 * 0.309017 - fVar51 * 0.809017) + fVar36;
              fVar38 = (fVar37 * 0.309017 - fVar53 * 0.809017) + fVar38;
              fVar40 = (fVar39 * 0.309017 - fVar55 * 0.809017) + fVar40;
              fVar42 = (fVar41 * 0.309017 - fVar57 * 0.809017) + fVar42;
              fVar35 = fVar43 * 0.58778524 + fVar31 * 0.95105654;
              fVar37 = fVar44 * 0.58778524 + fVar32 * 0.95105654;
              fVar39 = fVar45 * 0.58778524 + fVar33 * 0.95105654;
              fVar41 = fVar46 * 0.58778524 + fVar34 * 0.95105654;
              fVar31 = fVar31 * 0.58778524 - fVar43 * 0.95105654;
              fVar32 = fVar32 * 0.58778524 - fVar44 * 0.95105654;
              fVar33 = fVar33 * 0.58778524 - fVar45 * 0.95105654;
              fVar34 = fVar34 * 0.58778524 - fVar46 * 0.95105654;
              pafVar21 = pafVar28 + lVar16;
              (*pafVar21)[0] = fVar47 - fVar35;
              (*pafVar21)[1] = fVar48 - fVar37;
              (*pafVar21)[2] = fVar49 - fVar39;
              (*pafVar21)[3] = fVar50 - fVar41;
              pafVar21 = pafVar6 + lVar16;
              (*pafVar21)[0] = fVar36 - fVar31;
              (*pafVar21)[1] = fVar38 - fVar32;
              (*pafVar21)[2] = fVar40 - fVar33;
              (*pafVar21)[3] = fVar42 - fVar34;
              pafVar21 = pafVar26 + lVar16;
              (*pafVar21)[0] = fVar31 + fVar36;
              (*pafVar21)[1] = fVar32 + fVar38;
              (*pafVar21)[2] = fVar33 + fVar40;
              (*pafVar21)[3] = fVar34 + fVar42;
              pafVar21 = pafVar11 + lVar16;
              (*pafVar21)[0] = fVar35 + fVar47;
              (*pafVar21)[1] = fVar37 + fVar48;
              (*pafVar21)[2] = fVar39 + fVar49;
              (*pafVar21)[3] = fVar41 + fVar50;
              pafVar11 = pafVar11 + lVar20;
              pafVar26 = pafVar26 + lVar20;
              pafVar6 = pafVar6 + lVar20;
              pafVar28 = pafVar28 + lVar20;
              pafVar7 = pafVar7 + lVar20;
              pafVar23 = pafVar23 + lVar20 * 5;
              uVar13 = uVar13 - 1;
            } while (uVar13 != 0);
            if (local_100 != 1) {
              lVar14 = (long)(local_100 * -6 + -2);
              pafVar17 = local_f8 + lVar16 + lVar10 + 3;
              pafVar11 = local_f8 + lVar16 + lVar25 + 3;
              pafVar26 = local_f8 + lVar16 + lVar27 + 3;
              pafVar6 = local_f8 + lVar16 + lVar24 + 3;
              lVar10 = (long)(iVar9 + local_100) * 4;
              lVar24 = (long)iVar9 * 4;
              lVar25 = (long)(local_100 + iVar12) * 4;
              pafVar28 = local_f8 + lVar16 + lVar22 + 3;
              pafVar7 = input_readonly + lVar14 + lVar20 * 6 + 4;
              pafVar23 = input_readonly + lVar14 + lVar20 * 10 + 4;
              pafVar21 = input_readonly + lVar14 + lVar20 * 8 + 4;
              local_e0 = input_readonly + lVar14 + (long)(local_100 + 2) + lVar20 * 9 + -2;
              local_c8 = input_readonly + lVar14 + (long)(local_100 + 2) + lVar20 * 7 + -2;
              lVar16 = 1;
              do {
                if (2 < local_100) {
                  lVar27 = 3;
                  lVar22 = 0;
                  pafVar8 = local_e0;
                  pafVar18 = local_c8;
                  do {
                    pfVar2 = pafVar21[-1] + lVar22;
                    pfVar1 = *pafVar21 + lVar22;
                    fVar31 = *pfVar1 + (*pafVar18)[0];
                    fVar32 = pfVar1[1] + (*pafVar18)[1];
                    fVar33 = pfVar1[2] + (*pafVar18)[2];
                    fVar34 = pfVar1[3] + (*pafVar18)[3];
                    fVar67 = *pfVar1 - (*pafVar18)[0];
                    fVar68 = pfVar1[1] - (*pafVar18)[1];
                    fVar69 = pfVar1[2] - (*pafVar18)[2];
                    fVar70 = pfVar1[3] - (*pafVar18)[3];
                    pfVar3 = pafVar23[-1] + lVar22;
                    pfVar1 = *pafVar23 + lVar22;
                    fVar51 = *pfVar1 + (*pafVar8)[0];
                    fVar53 = pfVar1[1] + (*pafVar8)[1];
                    fVar55 = pfVar1[2] + (*pafVar8)[2];
                    fVar57 = pfVar1[3] + (*pafVar8)[3];
                    fVar43 = *pfVar1 - (*pafVar8)[0];
                    fVar44 = pfVar1[1] - (*pafVar8)[1];
                    fVar45 = pfVar1[2] - (*pafVar8)[2];
                    fVar46 = pfVar1[3] - (*pafVar8)[3];
                    fVar59 = *pfVar2 - pafVar18[-1][0];
                    fVar60 = pfVar2[1] - pafVar18[-1][1];
                    fVar61 = pfVar2[2] - pafVar18[-1][2];
                    fVar62 = pfVar2[3] - pafVar18[-1][3];
                    fVar75 = *pfVar2 + pafVar18[-1][0];
                    fVar76 = pfVar2[1] + pafVar18[-1][1];
                    fVar77 = pfVar2[2] + pafVar18[-1][2];
                    fVar78 = pfVar2[3] + pafVar18[-1][3];
                    fVar63 = *pfVar3 - pafVar8[-1][0];
                    fVar64 = pfVar3[1] - pafVar8[-1][1];
                    fVar65 = pfVar3[2] - pafVar8[-1][2];
                    fVar66 = pfVar3[3] - pafVar8[-1][3];
                    fVar52 = *pfVar3 + pafVar8[-1][0];
                    fVar54 = pfVar3[1] + pafVar8[-1][1];
                    fVar56 = pfVar3[2] + pafVar8[-1][2];
                    fVar58 = pfVar3[3] + pafVar8[-1][3];
                    pfVar1 = pafVar7[-1] + lVar22;
                    fVar36 = *pfVar1;
                    fVar38 = pfVar1[1];
                    fVar40 = pfVar1[2];
                    fVar42 = pfVar1[3];
                    pfVar1 = pafVar28[-1] + lVar22;
                    *pfVar1 = fVar75 + fVar52 + fVar36;
                    pfVar1[1] = fVar76 + fVar54 + fVar38;
                    pfVar1[2] = fVar77 + fVar56 + fVar40;
                    pfVar1[3] = fVar78 + fVar58 + fVar42;
                    pfVar1 = *pafVar7 + lVar22;
                    fVar35 = *pfVar1;
                    fVar37 = pfVar1[1];
                    fVar39 = pfVar1[2];
                    fVar41 = pfVar1[3];
                    pfVar1 = *pafVar28 + lVar22;
                    *pfVar1 = fVar67 + fVar43 + fVar35;
                    pfVar1[1] = fVar68 + fVar44 + fVar37;
                    pfVar1[2] = fVar69 + fVar45 + fVar39;
                    pfVar1[3] = fVar70 + fVar46 + fVar41;
                    fVar47 = (fVar75 * 0.309017 - fVar52 * 0.809017) + fVar36;
                    fVar48 = (fVar76 * 0.309017 - fVar54 * 0.809017) + fVar38;
                    fVar49 = (fVar77 * 0.309017 - fVar56 * 0.809017) + fVar40;
                    fVar50 = (fVar78 * 0.309017 - fVar58 * 0.809017) + fVar42;
                    fVar71 = (fVar67 * 0.309017 - fVar43 * 0.809017) + fVar35;
                    fVar72 = (fVar68 * 0.309017 - fVar44 * 0.809017) + fVar37;
                    fVar73 = (fVar69 * 0.309017 - fVar45 * 0.809017) + fVar39;
                    fVar74 = (fVar70 * 0.309017 - fVar46 * 0.809017) + fVar41;
                    fVar36 = (fVar52 * 0.309017 - fVar75 * 0.809017) + fVar36;
                    fVar38 = (fVar54 * 0.309017 - fVar76 * 0.809017) + fVar38;
                    fVar40 = (fVar56 * 0.309017 - fVar77 * 0.809017) + fVar40;
                    fVar42 = (fVar58 * 0.309017 - fVar78 * 0.809017) + fVar42;
                    fVar35 = (fVar43 * 0.309017 - fVar67 * 0.809017) + fVar35;
                    fVar37 = (fVar44 * 0.309017 - fVar68 * 0.809017) + fVar37;
                    fVar39 = (fVar45 * 0.309017 - fVar69 * 0.809017) + fVar39;
                    fVar41 = (fVar46 * 0.309017 - fVar70 * 0.809017) + fVar41;
                    fVar67 = fVar63 * 0.58778524 + fVar59 * 0.95105654;
                    fVar68 = fVar64 * 0.58778524 + fVar60 * 0.95105654;
                    fVar69 = fVar65 * 0.58778524 + fVar61 * 0.95105654;
                    fVar70 = fVar66 * 0.58778524 + fVar62 * 0.95105654;
                    fVar75 = fVar51 * 0.58778524 + fVar31 * 0.95105654;
                    fVar76 = fVar53 * 0.58778524 + fVar32 * 0.95105654;
                    fVar77 = fVar55 * 0.58778524 + fVar33 * 0.95105654;
                    fVar78 = fVar57 * 0.58778524 + fVar34 * 0.95105654;
                    fVar52 = fVar59 * 0.58778524 - fVar63 * 0.95105654;
                    fVar54 = fVar60 * 0.58778524 - fVar64 * 0.95105654;
                    fVar56 = fVar61 * 0.58778524 - fVar65 * 0.95105654;
                    fVar58 = fVar62 * 0.58778524 - fVar66 * 0.95105654;
                    fVar43 = fVar31 * 0.58778524 - fVar51 * 0.95105654;
                    fVar44 = fVar32 * 0.58778524 - fVar53 * 0.95105654;
                    fVar45 = fVar33 * 0.58778524 - fVar55 * 0.95105654;
                    fVar46 = fVar34 * 0.58778524 - fVar57 * 0.95105654;
                    fVar51 = fVar36 - fVar43;
                    fVar53 = fVar38 - fVar44;
                    fVar55 = fVar40 - fVar45;
                    fVar57 = fVar42 - fVar46;
                    fVar43 = fVar43 + fVar36;
                    fVar44 = fVar44 + fVar38;
                    fVar45 = fVar45 + fVar40;
                    fVar46 = fVar46 + fVar42;
                    fVar63 = fVar52 + fVar35;
                    fVar64 = fVar54 + fVar37;
                    fVar65 = fVar56 + fVar39;
                    fVar66 = fVar58 + fVar41;
                    fVar35 = fVar35 - fVar52;
                    fVar37 = fVar37 - fVar54;
                    fVar39 = fVar39 - fVar56;
                    fVar41 = fVar41 - fVar58;
                    fVar52 = fVar75 + fVar47;
                    fVar54 = fVar76 + fVar48;
                    fVar56 = fVar77 + fVar49;
                    fVar58 = fVar78 + fVar50;
                    fVar47 = fVar47 - fVar75;
                    fVar48 = fVar48 - fVar76;
                    fVar49 = fVar49 - fVar77;
                    fVar50 = fVar50 - fVar78;
                    fVar59 = fVar71 - fVar67;
                    fVar60 = fVar72 - fVar68;
                    fVar61 = fVar73 - fVar69;
                    fVar62 = fVar74 - fVar70;
                    fVar67 = fVar67 + fVar71;
                    fVar68 = fVar68 + fVar72;
                    fVar69 = fVar69 + fVar73;
                    fVar70 = fVar70 + fVar74;
                    fVar36 = *(float *)((long)wa + lVar22 + (long)iVar12 * 4);
                    fVar38 = *(float *)((long)wa + lVar22 + (long)iVar12 * 4 + 4);
                    fVar40 = *(float *)((long)wa + lVar22 + lVar25);
                    fVar42 = *(float *)((long)wa + lVar22 + lVar25 + 4);
                    fVar31 = *(float *)((long)wa + lVar22 + lVar24);
                    fVar32 = *(float *)((long)wa + lVar22 + lVar24 + 4);
                    fVar33 = *(float *)((long)wa + lVar22 + lVar10);
                    fVar34 = *(float *)((long)wa + lVar22 + lVar10 + 4);
                    pfVar1 = pafVar6[-1] + lVar22;
                    *pfVar1 = fVar47 * fVar36 - fVar38 * fVar67;
                    pfVar1[1] = fVar48 * fVar36 - fVar38 * fVar68;
                    pfVar1[2] = fVar49 * fVar36 - fVar38 * fVar69;
                    pfVar1[3] = fVar50 * fVar36 - fVar38 * fVar70;
                    pfVar1 = *pafVar6 + lVar22;
                    *pfVar1 = fVar36 * fVar67 + fVar47 * fVar38;
                    pfVar1[1] = fVar36 * fVar68 + fVar48 * fVar38;
                    pfVar1[2] = fVar36 * fVar69 + fVar49 * fVar38;
                    pfVar1[3] = fVar36 * fVar70 + fVar50 * fVar38;
                    pfVar1 = pafVar26[-1] + lVar22;
                    *pfVar1 = fVar51 * fVar40 - fVar42 * fVar63;
                    pfVar1[1] = fVar53 * fVar40 - fVar42 * fVar64;
                    pfVar1[2] = fVar55 * fVar40 - fVar42 * fVar65;
                    pfVar1[3] = fVar57 * fVar40 - fVar42 * fVar66;
                    pfVar1 = *pafVar26 + lVar22;
                    *pfVar1 = fVar40 * fVar63 + fVar51 * fVar42;
                    pfVar1[1] = fVar40 * fVar64 + fVar53 * fVar42;
                    pfVar1[2] = fVar40 * fVar65 + fVar55 * fVar42;
                    pfVar1[3] = fVar40 * fVar66 + fVar57 * fVar42;
                    pfVar1 = pafVar11[-1] + lVar22;
                    *pfVar1 = fVar43 * fVar31 - fVar32 * fVar35;
                    pfVar1[1] = fVar44 * fVar31 - fVar32 * fVar37;
                    pfVar1[2] = fVar45 * fVar31 - fVar32 * fVar39;
                    pfVar1[3] = fVar46 * fVar31 - fVar32 * fVar41;
                    pfVar1 = *pafVar11 + lVar22;
                    *pfVar1 = fVar31 * fVar35 + fVar43 * fVar32;
                    pfVar1[1] = fVar31 * fVar37 + fVar44 * fVar32;
                    pfVar1[2] = fVar31 * fVar39 + fVar45 * fVar32;
                    pfVar1[3] = fVar31 * fVar41 + fVar46 * fVar32;
                    pfVar1 = pafVar17[-1] + lVar22;
                    *pfVar1 = fVar52 * fVar33 - fVar34 * fVar59;
                    pfVar1[1] = fVar54 * fVar33 - fVar34 * fVar60;
                    pfVar1[2] = fVar56 * fVar33 - fVar34 * fVar61;
                    pfVar1[3] = fVar58 * fVar33 - fVar34 * fVar62;
                    pfVar1 = *pafVar17 + lVar22;
                    *pfVar1 = fVar33 * fVar59 + fVar52 * fVar34;
                    pfVar1[1] = fVar33 * fVar60 + fVar54 * fVar34;
                    pfVar1[2] = fVar33 * fVar61 + fVar56 * fVar34;
                    pfVar1[3] = fVar33 * fVar62 + fVar58 * fVar34;
                    lVar27 = lVar27 + 2;
                    lVar22 = lVar22 + 8;
                    pafVar8 = pafVar8 + -2;
                    pafVar18 = pafVar18 + -2;
                  } while (lVar27 <= lVar20);
                }
                lVar16 = lVar16 + 1;
                pafVar17 = pafVar17 + lVar20;
                pafVar11 = pafVar11 + lVar20;
                pafVar26 = pafVar26 + lVar20;
                pafVar6 = pafVar6 + lVar20;
                pafVar28 = pafVar28 + lVar20;
                pafVar7 = pafVar7 + lVar20 * 5;
                pafVar23 = pafVar23 + lVar20 * 5;
                pafVar21 = pafVar21 + lVar20 * 5;
                local_e0 = local_e0 + lVar20 * 5;
                local_c8 = local_c8 + lVar20 * 5;
              } while (lVar16 != lVar19);
            }
          }
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                        ,0x40f,
                        "v4sf *rfftb1_ps(int, const v4sf *, v4sf *, v4sf *, const float *, const int *)"
                       );
        }
        lVar15 = lVar15 + 1;
        iVar12 = iVar12 + (iVar5 + -1) * local_100;
        bVar30 = local_f8 == work2;
        input_readonly = work1;
        local_f8 = work2;
        if (bVar30) {
          input_readonly = work2;
          local_f8 = work1;
        }
        l1 = iVar5 * l1;
      } while (lVar15 != (ulong)uVar4 + 1);
    }
    return input_readonly;
  }
  __assert_fail("in != out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                ,0x3f6,
                "v4sf *rfftb1_ps(int, const v4sf *, v4sf *, v4sf *, const float *, const int *)");
}

Assistant:

static NEVER_INLINE(v4sf *) rfftb1_ps(int n, const v4sf *input_readonly, v4sf *work1, v4sf *work2, 
                                      const float *wa, const int *ifac) {  
  v4sf *in  = (v4sf*)input_readonly;
  v4sf *out = (in == work2 ? work1 : work2);
  int nf = ifac[1], k1;
  int l1 = 1;
  int iw = 0;
  assert(in != out);
  for (k1=1; k1<=nf; k1++) {
    int ip = ifac[k1 + 1];
    int l2 = ip*l1;
    int ido = n / l2;
    switch (ip) {
      case 5: {
        int ix2 = iw + ido;
        int ix3 = ix2 + ido;
        int ix4 = ix3 + ido;
        radb5_ps(ido, l1, in, out, &wa[iw], &wa[ix2], &wa[ix3], &wa[ix4]);
      } break;
      case 4: {
        int ix2 = iw + ido;
        int ix3 = ix2 + ido;
        radb4_ps(ido, l1, in, out, &wa[iw], &wa[ix2], &wa[ix3]);
      } break;
      case 3: {
        int ix2 = iw + ido;
        radb3_ps(ido, l1, in, out, &wa[iw], &wa[ix2]);
      } break;
      case 2:
        radb2_ps(ido, l1, in, out, &wa[iw]);
        break;
      default:
        assert(0);
        break;
    }
    l1 = l2;
    iw += (ip - 1)*ido;

    if (out == work2) {
      out = work1; in = work2;
    } else {
      out = work2; in = work1;
    }
  }
  return in; /* this is in fact the output .. */
}